

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

Matrix3x3 * __thiscall CMU462::Matrix3x3::T(Matrix3x3 *__return_storage_ptr__,Matrix3x3 *this)

{
  double dVar1;
  double *pdVar2;
  undefined4 local_28;
  undefined4 local_24;
  int j;
  int i;
  Matrix3x3 *A;
  Matrix3x3 *this_local;
  Matrix3x3 *B;
  
  Matrix3x3(__return_storage_ptr__);
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
      pdVar2 = operator()(this,local_28,local_24);
      dVar1 = *pdVar2;
      pdVar2 = operator()(__return_storage_ptr__,local_24,local_28);
      *pdVar2 = dVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 Matrix3x3::T( void ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 B;

    for( int i = 0; i < 3; i++ )
    for( int j = 0; j < 3; j++ )
    {
       B(i,j) = A(j,i);
    }

    return B;
  }